

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O2

void sbs_adopt(sbstring *sbs,char *buffer,size_t size)

{
  size_t sVar1;
  
  if (size == 0 || buffer == (char *)0x0) {
    sbs->size = 0;
    sbs->begin = (char *)0x0;
    sbs->end = (char *)0x0;
  }
  else {
    sVar1 = strlen(buffer);
    if (sbs == (sbstring *)0x0) {
      __assert_fail("sbs",
                    "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/strings.c"
                    ,0xed,"void sbs_adopt(struct sbstring *, char *, size_t)");
    }
    if (size <= sVar1) {
      __assert_fail("size > len",
                    "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/strings.c"
                    ,0xee,"void sbs_adopt(struct sbstring *, char *, size_t)");
    }
    sbs->begin = buffer;
    sbs->size = size;
    sbs->end = buffer + sVar1;
  }
  return;
}

Assistant:

void sbs_adopt(struct sbstring *sbs, char *buffer, size_t size)
{
    if (buffer && size > 0) {
        size_t len = strlen(buffer);
        assert(sbs);
        assert(size > len);
        sbs->begin = buffer;
        sbs->size = size;
        sbs->end = buffer + len;
    }
    else {
        sbs->end = sbs->begin = NULL;
        sbs->size = 0;
    }
}